

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O1

void output_module_primary_report
               (string *module,output_format out_fmt,bool track_sources,bool track_tests)

{
  module_primary_html_actions actions;
  module_primary_actions local_48 [2];
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  if (out_fmt == output_format_csv) {
    local_48[0]._vptr_module_primary_actions = (_func_int **)&PTR_heading_00121158;
    local_30 = 0;
    local_28 = 0;
    local_38 = &local_28;
    output_module_primary_report(module,local_48,track_sources,track_tests);
    local_48[0]._vptr_module_primary_actions = (_func_int **)&PTR_heading_00121158;
    if (local_38 != &local_28) {
      operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
    }
  }
  else {
    if (out_fmt == output_format_html) {
      local_48[0]._vptr_module_primary_actions = (_func_int **)&PTR_heading_00120fb0;
    }
    else {
      local_48[0]._vptr_module_primary_actions = (_func_int **)&PTR_heading_001211b8;
    }
    output_module_primary_report(module,local_48,track_sources,track_tests);
  }
  return;
}

Assistant:

static void output_module_primary_report( std::string const & module, output_format out_fmt, bool track_sources, bool track_tests )
{
    if( out_fmt == output_format_html )
    {
        module_primary_html_actions actions;
        output_module_primary_report( module, actions, track_sources, track_tests );
    }
    else if( out_fmt == output_format_csv )
    {
        module_primary_csv_actions actions;
        output_module_primary_report( module, actions, track_sources, track_tests );
    }
    else
    {
        module_primary_txt_actions actions;
        output_module_primary_report( module, actions, track_sources, track_tests );
    }
}